

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

shared_ptr<AixLog::SinkCout> AixLog::Log::init<AixLog::SinkCout,AixLog::Severity&>(Severity *params)

{
  initializer_list<std::shared_ptr<AixLog::Sink>_> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  allocator_type *in_RDI;
  shared_ptr<AixLog::SinkCout> sVar1;
  shared_ptr<AixLog::SinkCout> *sink;
  shared_ptr<AixLog::SinkCout> *in_stack_ffffffffffffff48;
  shared_ptr<AixLog::Sink> *in_stack_ffffffffffffff50;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
  *in_stack_ffffffffffffff60;
  shared_ptr<AixLog::Sink> *local_90;
  allocator_type *this;
  element_type *peVar2;
  undefined1 *puVar3;
  Severity *in_stack_ffffffffffffffa0;
  Log *in_stack_ffffffffffffffa8;
  undefined1 local_50 [16];
  shared_ptr<AixLog::Sink> local_40;
  EVP_PKEY_CTX local_30 [31];
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  instance();
  add_logsink<AixLog::SinkCout,AixLog::Severity&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  peVar2 = (element_type *)local_50;
  std::shared_ptr<AixLog::Sink>::shared_ptr<AixLog::SinkCout,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_40.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  puVar3 = &stack0xffffffffffffffaf;
  local_40.super___shared_ptr<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  std::allocator<std::shared_ptr<AixLog::Sink>_>::allocator
            ((allocator<std::shared_ptr<AixLog::Sink>_> *)0x12066f);
  __l._M_len = (size_type)puVar3;
  __l._M_array = (iterator)peVar2;
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  vector((vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> *)
         this,__l,in_RDI);
  init(local_30);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  ~vector(in_stack_ffffffffffffff60);
  std::allocator<std::shared_ptr<AixLog::Sink>_>::~allocator
            ((allocator<std::shared_ptr<AixLog::Sink>_> *)0x1206b6);
  local_90 = &local_40;
  do {
    local_90 = local_90 + -1;
    std::shared_ptr<AixLog::Sink>::~shared_ptr((shared_ptr<AixLog::Sink> *)0x1206dc);
  } while (local_90 != (shared_ptr<AixLog::Sink> *)local_50);
  sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<AixLog::SinkCout>)
         sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<T> init(Ts&&... params) {
    std::shared_ptr<T> sink =
        Log::instance().add_logsink<T>(std::forward<Ts>(params)...);
    init({sink});
    return sink;
  }